

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ExpressionLhs<const_unsigned_int_&>::endExpression(ExpressionLhs<const_unsigned_int_&> *this)

{
  ResultBuilder *pRVar1;
  Catch local_38 [39];
  byte local_11;
  ExpressionLhs<const_unsigned_int_&> *pEStack_10;
  bool value;
  ExpressionLhs<const_unsigned_int_&> *this_local;
  
  local_11 = *this->m_lhs != 0;
  pRVar1 = this->m_rb;
  pEStack_10 = this;
  Catch::toString_abi_cxx11_(local_38,(bool)local_11);
  pRVar1 = ResultBuilder::setLhs(pRVar1,(string *)local_38);
  pRVar1 = ResultBuilder::setResultType(pRVar1,(bool)(local_11 & 1));
  ResultBuilder::endExpression(pRVar1);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void endExpression() {
        bool value = m_lhs ? true : false;
        m_rb
            .setLhs( Catch::toString( value ) )
            .setResultType( value )
            .endExpression();
    }